

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O2

int re_match(re_pattern_buffer *__buffer,char *__string,int __length,int __start,
            re_registers *__regs)

{
  byte *pbVar1;
  char *__s2;
  re_group_register *__src;
  int iVar2;
  undefined4 in_register_0000000c;
  int __length_00;
  undefined4 in_register_00000014;
  uint id;
  ulong uVar3;
  byte bVar4;
  re_group_register *in_R9;
  int iVar5;
  byte *p;
  ulong uVar6;
  bool bVar7;
  re_machine sub_machine;
  re_group_register regs1 [10];
  re_group_register regs2 [10];
  
  p = (byte *)CONCAT44(in_register_00000014,__length);
  uVar6 = CONCAT44(in_register_0000000c,__start);
  id = __regs->num_regs;
  re_note_group((re_context *)__buffer,in_R9,id,(char *)p);
  iVar5 = 0;
  if (id != *(uint *)&__regs->field_0x4) {
    do {
      uVar3 = __buffer->used;
      pbVar1 = (byte *)((long)(int)id * 0x20 + uVar3);
      re_note_group((re_context *)__buffer,in_R9,id,(char *)p);
      if ((*(byte *)(uVar3 + 0x18 + (long)(int)id * 0x20) & 6) != 0) {
switchD_0021b7a4_caseD_1:
        if (*(int *)(pbVar1 + 8) != -1) {
          memcpy(regs1,in_R9,0xa0);
          sub_machine.init = *(re_state_id *)(pbVar1 + 4);
          sub_machine.final = *(re_state_id *)&__regs->field_0x4;
          __length_00 = (int)p;
          iVar2 = re_match(__buffer,__string,__length_00,(int)uVar6,(re_registers *)&sub_machine);
          memcpy(regs2,in_R9,0xa0);
          sub_machine.init = *(re_state_id *)(pbVar1 + 8);
          sub_machine.final = *(re_state_id *)&__regs->field_0x4;
          iVar5 = re_match(__buffer,__string,__length_00,(int)uVar6,(re_registers *)&sub_machine);
          if ((iVar2 < 0) && (iVar5 < 0)) {
            return -1;
          }
          __src = regs2;
          if (iVar5 < iVar2) {
            iVar5 = iVar2;
            __src = regs1;
          }
          memcpy(in_R9,__src,0xa0);
          return iVar5 + (__length_00 - __length);
        }
        goto LAB_0021b772;
      }
      bVar4 = *pbVar1;
      switch(bVar4) {
      case 1:
        goto switchD_0021b7a4_caseD_1;
      case 2:
        if (uVar6 == 0) {
          return -1;
        }
        goto LAB_0021b963;
      case 3:
        if (p != (byte *)__string) {
          return -1;
        }
        break;
      case 4:
        if (uVar6 != 0) {
          return -1;
        }
        uVar6 = 0;
        break;
      case 5:
        if ((p != (byte *)__string) && (iVar5 = re_is_word_char(p[-1]), iVar5 != 0)) {
          return -1;
        }
        if (uVar6 == 0) {
          return -1;
        }
        bVar4 = *p;
        goto LAB_0021b97e;
      case 6:
        if (uVar6 == 0) {
          if (p == (byte *)__string) {
            return -1;
          }
        }
        else {
          iVar5 = re_is_word_char(*p);
          if (p == (byte *)__string) {
            return -1;
          }
          if (iVar5 != 0) {
            return -1;
          }
        }
        bVar4 = p[-1];
LAB_0021b97e:
        iVar5 = re_is_word_char(bVar4);
        if (iVar5 == 0) {
          return -1;
        }
        break;
      case 7:
        if (uVar6 == 0) {
          return -1;
        }
        iVar5 = re_is_word_char(*p);
        if (iVar5 == 0) {
          return -1;
        }
        goto LAB_0021b963;
      case 8:
        if (uVar6 == 0) {
          return -1;
        }
        iVar5 = re_is_word_char(*p);
        if (iVar5 != 0) {
          return -1;
        }
        goto LAB_0021b963;
      case 9:
      case 10:
        iVar2 = 0;
        iVar5 = 0;
        if (p != (byte *)__string) {
          iVar5 = re_is_word_char(p[-1]);
        }
        if (uVar6 != 0) {
          iVar2 = re_is_word_char(*p);
        }
        if (bVar4 == 9 && iVar5 == iVar2) {
          return -1;
        }
        if (bVar4 == 10 && iVar5 != iVar2) {
          return -1;
        }
        break;
      case 0xb:
      case 0xc:
        if (uVar6 == 0) {
          return -1;
        }
        bVar7 = (1 << (*p & 7) & (uint)*(byte *)(*(long *)(pbVar1 + 0x10) + (ulong)(*p >> 3))) == 0;
        if (bVar4 == 0xb && bVar7) {
          return -1;
        }
        if (bVar4 == 0xc && !bVar7) {
          return -1;
        }
        goto LAB_0021b963;
      case 0xd:
      case 0xe:
      case 0xf:
      case 0x10:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x14:
      case 0x15:
      case 0x16:
        __s2 = in_R9[(ulong)bVar4 - 0xd].start_ofs;
        if (__s2 == (char *)0x0) {
          return -1;
        }
        if (in_R9[(ulong)bVar4 - 0xd].end_ofs == (char *)0x0) {
          return -1;
        }
        uVar3 = (long)in_R9[(ulong)bVar4 - 0xd].end_ofs - (long)__s2;
        bVar7 = uVar6 < uVar3;
        uVar6 = uVar6 - uVar3;
        if (bVar7) {
          return -1;
        }
        iVar5 = bcmp(p,__s2,uVar3);
        if (iVar5 != 0) {
          return -1;
        }
        p = p + uVar3;
        break;
      default:
        if (uVar6 == 0) {
          return -1;
        }
        if (bVar4 != *p) {
          return -1;
        }
LAB_0021b963:
        p = p + 1;
        uVar6 = uVar6 - 1;
      }
LAB_0021b772:
      id = *(uint *)(pbVar1 + 4);
    } while (id != *(uint *)&__regs->field_0x4);
    re_note_group((re_context *)__buffer,in_R9,id,(char *)p);
    iVar5 = (int)p - __length;
  }
  return iVar5;
}

Assistant:

static int re_match(re_context *ctx, const char *entire_str,
                    const char *str, size_t origlen,
                    const re_machine *machine, re_group_register *regs)
{
    re_state_id cur_state;
    const char *p;
    size_t curlen;

    /* start at the machine's initial state */
    cur_state = machine->init;

    /* start at the beginning of the string */
    p = str;
    curlen = origlen;

    /* note any group involved in the initial state */
    re_note_group(ctx, regs, cur_state, p);

    /* 
     *   if we're starting in the final state, immediately return success
     *   with a zero-length match 
     */
    if (cur_state == machine->final)
    {
        /* return success with a zero-length match */
        return 0;
    }

    /* run the machine */
    for (;;)
    {
        re_tuple *tuple;

        /* get the tuple for this state */
        tuple = &ctx->tuple_arr[cur_state];

        /* if this is a group state, adjust the group registers */
        re_note_group(ctx, regs, cur_state, p);
        
        /* see what kind of state we're in */
        if (!(tuple->flags & (RE_STATE_GROUP_BEGIN | RE_STATE_GROUP_END))
            && tuple->ch != RE_EPSILON)
        {
            /*
             *   This is a character or group recognizer state.  If we
             *   match the character or group, continue on to the next
             *   state; otherwise, return failure.
             */
            switch(tuple->ch)
            {
            case RE_GROUP_MATCH_0:
            case RE_GROUP_MATCH_0 + 1:
            case RE_GROUP_MATCH_0 + 2:
            case RE_GROUP_MATCH_0 + 3:
            case RE_GROUP_MATCH_0 + 4:
            case RE_GROUP_MATCH_0 + 5:
            case RE_GROUP_MATCH_0 + 6:
            case RE_GROUP_MATCH_0 + 7:
            case RE_GROUP_MATCH_0 + 8:
            case RE_GROUP_MATCH_0 + 9:
                {
                    int group_num;
                    re_group_register *group_reg;
                    size_t reg_len;
                    
                    /* it's a group - get the group number */
                    group_num = tuple->ch - RE_GROUP_MATCH_0;
                    group_reg = &regs[group_num];
                    
                    /* 
                     *   if this register isn't defined, there's nothing
                     *   to match, so fail 
                     */
                    if (group_reg->start_ofs == 0 || group_reg->end_ofs == 0)
                        return -1;
                    
                    /* calculate the length of the register value */
                    reg_len = group_reg->end_ofs - group_reg->start_ofs;
                    
                    /* if we don't have enough left to match, it fails */
                    if (curlen < reg_len)
                        return -1;
                    
                    /* if the string doesn't match exactly, we fail */
                    if (memcmp(p, group_reg->start_ofs, reg_len) != 0)
                        return -1;
                    
                    /*
                     *   It matches exactly - skip the entire length of
                     *   the register in the source string 
                     */
                    p += reg_len;
                    curlen -= reg_len;
                }
                break;

            case RE_TEXT_BEGIN:
                /* 
                 *   Match only the exact beginning of the string - if
                 *   we're anywhere else, this isn't a match.  If this
                 *   succeeds, we don't skip any characters.  
                 */
                if (p != entire_str)
                    return -1;
                break;

            case RE_TEXT_END:
                /*
                 *   Match only the exact end of the string - if we're
                 *   anywhere else, this isn't a match.  Don't skip any
                 *   characters on success.  
                 */
                if (curlen != 0)
                    return -1;
                break;

            case RE_WORD_BEGIN:
                /* 
                 *   if the previous character is a word character, we're
                 *   not at the beginning of a word 
                 */
                if (p != entire_str && re_is_word_char(*(p-1)))
                    return -1;

                /* 
                 *   if we're at the end of the string, or the current
                 *   character isn't the start of a word, we're not at the
                 *   beginning of a word 
                 */
                if (curlen == 0 || !re_is_word_char(*p))
                    return -1;
                break;

            case RE_WORD_END:
                /*
                 *   if the current character is a word character, we're not
                 *   at the end of a word 
                 */
                if (curlen != 0 && re_is_word_char(*p))
                    return -1;

                /*
                 *   if we're at the beginning of the string, or the
                 *   previous character is not a word character, we're not
                 *   at the end of a word 
                 */
                if (p == entire_str || !re_is_word_char(*(p-1)))
                    return -1;
                break;

            case RE_WORD_CHAR:
                /* if it's not a word character, it's a failure */
                if (curlen == 0 || !re_is_word_char(*p))
                    return -1;

                /* skip this character of input */
                ++p;
                --curlen;
                break;

            case RE_NON_WORD_CHAR:
                /* if it's a word character, it's a failure */
                if (curlen == 0 || re_is_word_char(*p))
                    return -1;

                /* skip the input */
                ++p;
                --curlen;
                break;

            case RE_WORD_BOUNDARY:
            case RE_NON_WORD_BOUNDARY:
                {
                    int prev_is_word;
                    int next_is_word;
                    int boundary;

                    /*
                     *   Determine if the previous character is a word
                     *   character -- if we're at the beginning of the
                     *   string, it's obviously not, otherwise check its
                     *   classification 
                     */
                    prev_is_word = (p != entire_str
                                    && re_is_word_char(*(p-1)));

                    /* make the same check for the current character */
                    next_is_word = (curlen != 0
                                    && re_is_word_char(*p));

                    /*
                     *   Determine if this is a boundary - it is if the
                     *   two states are different 
                     */
                    boundary = ((prev_is_word != 0) ^ (next_is_word != 0));

                    /* 
                     *   make sure it matches what was desired, and return
                     *   failure if not 
                     */
                    if ((tuple->ch == RE_WORD_BOUNDARY && !boundary)
                        || (tuple->ch == RE_NON_WORD_BOUNDARY && boundary))
                        return -1;
                }
                break;

            case RE_WILDCARD:
                /* make sure we have a character to match */
                if (curlen == 0)
                    return -1;

                /* skip this character */
                ++p;
                --curlen;
                break;

            case RE_RANGE:
            case RE_RANGE_EXCL:
                {
                    int match;
                    
                    /* make sure we have a character to match */
                    if (curlen == 0)
                        return -1;
                    
                    /* see if we match */
                    match = re_is_bit_set(tuple->char_range,
                                          (int)(unsigned char)*p);
                    
                    /* make sure we got what we wanted */
                    if ((tuple->ch == RE_RANGE && !match)
                        || (tuple->ch == RE_RANGE_EXCL && match))
                        return -1;

                    /* skip this character of the input */
                    ++p;
                    --curlen;
                }
                break;

            default:
                /* make sure we have an exact match */
                if (curlen == 0 || tuple->ch != *p)
                    return -1;

                /* skip this character of the input */
                ++p;
                --curlen;
                break;
            }

            /* 
             *   if we got this far, we were successful - move on to the
             *   next state 
             */
            cur_state = tuple->next_state_1;
        }
        else if (tuple->next_state_2 == RE_STATE_INVALID)
        {
            /*
             *   We have only one transition, so this state is entirely
             *   deterministic.  Simply move on to the next state. 
             */
            cur_state = tuple->next_state_1;
        }
        else
        {
            re_machine sub_machine;
            re_group_register regs1[RE_GROUP_REG_CNT];
            re_group_register regs2[RE_GROUP_REG_CNT];
            int ret1;
            int ret2;
            
            /*
             *   This state has two possible transitions, and we don't
             *   know which one to take.  So, try both, see which one
             *   works better, and return the result.  Try the first
             *   transition first.  Note that each separate attempt must
             *   use a separate copy of the registers.  
             */
            memcpy(regs1, regs, sizeof(regs1));
            sub_machine.init = tuple->next_state_1;
            sub_machine.final = machine->final;
            ret1 = re_match(ctx, entire_str, p, curlen, &sub_machine, regs1);

            /*
             *   Now try the second transition 
             */
            memcpy(regs2, regs, sizeof(regs2));
            sub_machine.init = tuple->next_state_2;
            sub_machine.final = machine->final;
            ret2 = re_match(ctx, entire_str, p, curlen, &sub_machine, regs2);

            /*
             *   If they both failed, the whole thing failed.  Otherwise,
             *   return the longer of the two, plus the length we
             *   ourselves matched previously.  Note that we return the
             *   register set from the winning match.  
             */
            if (ret1 < 0 && ret2 < 0)
            {
                /* they both failed */
                return -1;
            }
            else if (ret1 > ret2)
            {
                /* use the first register set and result length */
                memcpy(regs, regs1, sizeof(regs1));
                return ret1 + (p - str);
            }
            else
            {
                /* use the second register set and result length */
                memcpy(regs, regs2, sizeof(regs2));
                return ret2 + (p - str);
            }
        }

        /*
         *   If we're in the final state, return success 
         */
        if (cur_state == machine->final)
        {
            /* finish off any group involved in the final state */
            re_note_group(ctx, regs, cur_state, p);
            
            /* return the length we matched */
            return p - str;
        }
    }
}